

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall
Js::JavascriptLibrary::AddAccessorsToLibraryObject
          (JavascriptLibrary *this,DynamicObject *object,PropertyId propertyId,
          RecyclableObject *getterFunction,RecyclableObject *setterFunction)

{
  RecyclableObject *local_30;
  RecyclableObject *setterFunction_local;
  RecyclableObject *getterFunction_local;
  PropertyId propertyId_local;
  DynamicObject *object_local;
  JavascriptLibrary *this_local;
  
  setterFunction_local = getterFunction;
  if (getterFunction == (RecyclableObject *)0x0) {
    setterFunction_local = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
  }
  local_30 = setterFunction;
  if (setterFunction == (RecyclableObject *)0x0) {
    local_30 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
  }
  (*(object->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x2d])
            (object,(ulong)(uint)propertyId,setterFunction_local,local_30,0);
  (*(object->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x3e])(object,(ulong)(uint)propertyId,6);
  return;
}

Assistant:

void JavascriptLibrary::AddAccessorsToLibraryObject(DynamicObject* object, PropertyId propertyId, RecyclableObject* getterFunction, RecyclableObject* setterFunction)
    {
        if (getterFunction == nullptr)
        {
            getterFunction = GetUndefined();
        }

        if (setterFunction == nullptr)
        {
            setterFunction = GetUndefined();
        }

        object->SetAccessors(propertyId, getterFunction, setterFunction);
        object->SetAttributes(propertyId, PropertyConfigurable | PropertyWritable);
    }